

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall
cmFindCommon::GetIgnoredPaths
          (cmFindCommon *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ignore)

{
  cmMakefile *this_00;
  pointer pbVar1;
  long lVar2;
  string *i;
  pointer path;
  allocator<char> local_51;
  string local_50;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)((long)GetIgnoredPaths::paths + lVar2),&local_51);
    cmMakefile::GetDefExpandList(this_00,&local_50,ignore,false);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pbVar1 = (ignore->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (path = (ignore->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; path != pbVar1; path = path + 1) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
  }
  return;
}

Assistant:

void cmFindCommon::GetIgnoredPaths(std::vector<std::string>& ignore)
{
  static constexpr const char* paths[] = {
    "CMAKE_SYSTEM_IGNORE_PATH",
    "CMAKE_IGNORE_PATH",
  };

  // Construct the list of path roots with no trailing slashes.
  for (const char* pathName : paths) {
    // Get the list of paths to ignore from the variable.
    this->Makefile->GetDefExpandList(pathName, ignore);
  }

  for (std::string& i : ignore) {
    cmSystemTools::ConvertToUnixSlashes(i);
  }
}